

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O2

int dwarfstring_add_to(dwarfstring_s *g,size_t newlen)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char *__dest;
  size_t sVar4;
  
  sVar1 = g->s_size;
  sVar2 = g->s_avail;
  sVar4 = 0x1e;
  if (0x1e < newlen + 1) {
    sVar4 = newlen + 1;
  }
  __dest = (char *)malloc(sVar4);
  if (__dest == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar4 = sVar1 - sVar2;
    if (sVar4 != 0) {
      memcpy(__dest,g->s_data,sVar4);
    }
    if (g->s_malloc != '\0') {
      free(g->s_data);
    }
    g->s_data = __dest;
    __dest[sVar4] = '\0';
    g->s_size = newlen;
    g->s_avail = newlen - sVar4;
    g->s_malloc = '\x01';
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
dwarfstring_add_to(struct dwarfstring_s *g,size_t newlen)
{
    char *b          = 0;
    /*  s_size - s_avail is the string without counting
        the null following the string. So, is  strlen()  */
    size_t lastpos   = g->s_size - g->s_avail;
    size_t malloclen = newlen+1;

    /*  ASSERT: newlen as well as malloclen  are
        greater than g->s_size at both call points */
    if (malloclen < minimumnewlen) {
        malloclen = minimumnewlen;
    }
    /*  Not zeroing the new buffer block. */
    b = malloc(malloclen);
    if (!b) {
        return FALSE;
    }
    if (lastpos > 0) {
        /* Copying the non-null bytes in s_data. */
        memcpy(b,g->s_data,lastpos);
    }
    if (g->s_malloc) {
        free(g->s_data);
        g->s_data = 0;
    }
    g->s_data = b;
    /*  s_data[lastpos] is one past the end of anything
        counted as string
        in s_data at the point of call, and is guaranteed
        to be safe as we increased the size of s_data, we did not
        shrink.  And, too, we add 1 to newlen, always,
        so space for a terminating null byte is guaranteed
        available. */
    g->s_data[lastpos] = 0;
    g->s_size = newlen;
    g->s_avail = newlen - lastpos;
    g->s_malloc = TRUE;
    return TRUE;
}